

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_token.c
# Opt level: O0

char * token_name(gtoken_t token)

{
  char *pcStack_10;
  gtoken_t token_local;
  
  switch(token) {
  case TOK_EOF:
    pcStack_10 = "EOF";
    break;
  case TOK_ERROR:
    pcStack_10 = "ERROR";
    break;
  case TOK_COMMENT:
    pcStack_10 = "COMMENT";
    break;
  case TOK_STRING:
    pcStack_10 = "STRING";
    break;
  case TOK_NUMBER:
    pcStack_10 = "NUMBER";
    break;
  case TOK_IDENTIFIER:
    pcStack_10 = "IDENTIFIER";
    break;
  case TOK_SPECIAL:
    pcStack_10 = "SPECIAL";
    break;
  case TOK_MACRO:
    pcStack_10 = "MACRO";
    break;
  case TOK_KEY_FUNC:
    pcStack_10 = "func";
    break;
  case TOK_KEY_SUPER:
    pcStack_10 = "super";
    break;
  case TOK_KEY_DEFAULT:
    pcStack_10 = "default";
    break;
  case TOK_KEY_TRUE:
    pcStack_10 = "true";
    break;
  case TOK_KEY_FALSE:
    pcStack_10 = "false";
    break;
  case TOK_KEY_IF:
    pcStack_10 = "if";
    break;
  case TOK_KEY_ELSE:
    pcStack_10 = "else";
    break;
  case TOK_KEY_SWITCH:
    pcStack_10 = "switch";
    break;
  case TOK_KEY_BREAK:
    pcStack_10 = "break";
    break;
  case TOK_KEY_CONTINUE:
    pcStack_10 = "continue";
    break;
  case TOK_KEY_RETURN:
    pcStack_10 = "return";
    break;
  case TOK_KEY_WHILE:
    pcStack_10 = "while";
    break;
  case TOK_KEY_REPEAT:
    pcStack_10 = "repeat";
    break;
  case TOK_KEY_FOR:
    pcStack_10 = "for";
    break;
  case TOK_KEY_IN:
    pcStack_10 = "in";
    break;
  case TOK_KEY_ENUM:
    pcStack_10 = "enum";
    break;
  case TOK_KEY_CLASS:
    pcStack_10 = "class";
    break;
  case TOK_KEY_STRUCT:
    pcStack_10 = "struct";
    break;
  case TOK_KEY_PRIVATE:
    pcStack_10 = "private";
    break;
  case TOK_KEY_FILE:
    pcStack_10 = "file";
    break;
  case TOK_KEY_INTERNAL:
    pcStack_10 = "internal";
    break;
  case TOK_KEY_PUBLIC:
    pcStack_10 = "public";
    break;
  case TOK_KEY_STATIC:
    pcStack_10 = "static";
    break;
  case TOK_KEY_EXTERN:
    pcStack_10 = "extern";
    break;
  case TOK_KEY_LAZY:
    pcStack_10 = "lazy";
    break;
  case TOK_KEY_CONST:
    pcStack_10 = "const";
    break;
  case TOK_KEY_VAR:
    pcStack_10 = "var";
    break;
  case TOK_KEY_MODULE:
    pcStack_10 = "module";
    break;
  case TOK_KEY_IMPORT:
    pcStack_10 = "import";
    break;
  case TOK_KEY_CASE:
    pcStack_10 = "case";
    break;
  case TOK_KEY_EVENT:
    pcStack_10 = "event";
    break;
  case TOK_KEY_NULL:
    pcStack_10 = "null";
    break;
  case TOK_KEY_UNDEFINED:
    pcStack_10 = "undefined";
    break;
  case TOK_KEY_ISA:
    pcStack_10 = "is";
    break;
  case TOK_KEY_CURRFUNC:
    pcStack_10 = "_func";
    break;
  case TOK_KEY_CURRARGS:
    pcStack_10 = "_args";
    break;
  case TOK_OP_SHIFT_LEFT:
    pcStack_10 = "<<";
    break;
  case TOK_OP_SHIFT_RIGHT:
    pcStack_10 = ">>";
    break;
  case TOK_OP_MUL:
    pcStack_10 = "*";
    break;
  case TOK_OP_DIV:
    pcStack_10 = "/";
    break;
  case TOK_OP_REM:
    pcStack_10 = "%";
    break;
  case TOK_OP_BIT_AND:
    pcStack_10 = "&";
    break;
  case TOK_OP_ADD:
    pcStack_10 = "+";
    break;
  case TOK_OP_SUB:
    pcStack_10 = "-";
    break;
  case TOK_OP_BIT_OR:
    pcStack_10 = "|";
    break;
  case TOK_OP_BIT_XOR:
    pcStack_10 = "^";
    break;
  case TOK_OP_BIT_NOT:
    pcStack_10 = "~";
    break;
  case TOK_OP_RANGE_EXCLUDED:
    pcStack_10 = "..<";
    break;
  case TOK_OP_RANGE_INCLUDED:
    pcStack_10 = "...";
    break;
  case TOK_OP_LESS:
    pcStack_10 = "<";
    break;
  case TOK_OP_LESS_EQUAL:
    pcStack_10 = "<=";
    break;
  case TOK_OP_GREATER:
    pcStack_10 = ">";
    break;
  case TOK_OP_GREATER_EQUAL:
    pcStack_10 = ">=";
    break;
  case TOK_OP_ISEQUAL:
    pcStack_10 = "==";
    break;
  case TOK_OP_ISNOTEQUAL:
    pcStack_10 = "!=";
    break;
  case TOK_OP_ISIDENTICAL:
    pcStack_10 = "===";
    break;
  case TOK_OP_ISNOTIDENTICAL:
    pcStack_10 = "!==";
    break;
  case TOK_OP_PATTERN_MATCH:
    pcStack_10 = "~=";
    break;
  case TOK_OP_AND:
    pcStack_10 = "&&";
    break;
  case TOK_OP_OR:
    pcStack_10 = "||";
    break;
  case TOK_OP_TERNARY:
    pcStack_10 = "?";
    break;
  case TOK_OP_ASSIGN:
    pcStack_10 = "=";
    break;
  case TOK_OP_MUL_ASSIGN:
    pcStack_10 = "*=";
    break;
  case TOK_OP_DIV_ASSIGN:
    pcStack_10 = "/=";
    break;
  case TOK_OP_REM_ASSIGN:
    pcStack_10 = "%=";
    break;
  case TOK_OP_ADD_ASSIGN:
    pcStack_10 = "+=";
    break;
  case TOK_OP_SUB_ASSIGN:
    pcStack_10 = "-=";
    break;
  case TOK_OP_SHIFT_LEFT_ASSIGN:
    pcStack_10 = "<<=";
    break;
  case TOK_OP_SHIFT_RIGHT_ASSIGN:
    pcStack_10 = ">>=";
    break;
  case TOK_OP_BIT_AND_ASSIGN:
    pcStack_10 = "&=";
    break;
  case TOK_OP_BIT_OR_ASSIGN:
    pcStack_10 = "|=";
    break;
  case TOK_OP_BIT_XOR_ASSIGN:
    pcStack_10 = "^=";
    break;
  case TOK_OP_NOT:
    pcStack_10 = "!";
    break;
  case TOK_OP_SEMICOLON:
    pcStack_10 = ";";
    break;
  case TOK_OP_OPEN_PARENTHESIS:
    pcStack_10 = "(";
    break;
  case TOK_OP_COLON:
    pcStack_10 = ":";
    break;
  case TOK_OP_COMMA:
    pcStack_10 = ",";
    break;
  case TOK_OP_DOT:
    pcStack_10 = ".";
    break;
  case TOK_OP_CLOSED_PARENTHESIS:
    pcStack_10 = ")";
    break;
  case TOK_OP_OPEN_SQUAREBRACKET:
    pcStack_10 = "[";
    break;
  case TOK_OP_CLOSED_SQUAREBRACKET:
    pcStack_10 = "]";
    break;
  case TOK_OP_OPEN_CURLYBRACE:
    pcStack_10 = "{";
    break;
  case TOK_OP_CLOSED_CURLYBRACE:
    pcStack_10 = "}";
    break;
  case TOK_END:
    pcStack_10 = "";
    break;
  default:
    pcStack_10 = "UNRECOGNIZED TOKEN";
  }
  return pcStack_10;
}

Assistant:

const char *token_name (gtoken_t token) {
    switch (token) {
        case TOK_EOF: return "EOF";
        case TOK_ERROR: return "ERROR";
        case TOK_COMMENT: return "COMMENT";
        case TOK_STRING: return "STRING";
        case TOK_NUMBER: return "NUMBER";
        case TOK_IDENTIFIER: return "IDENTIFIER";
        case TOK_SPECIAL: return "SPECIAL";
        case TOK_MACRO: return "MACRO";

        // keywords
        case TOK_KEY_FILE: return "file";
        case TOK_KEY_FUNC: return "func";
        case TOK_KEY_SUPER: return "super";
        case TOK_KEY_DEFAULT: return "default";
        case TOK_KEY_TRUE: return "true";
        case TOK_KEY_FALSE: return "false";
        case TOK_KEY_IF: return "if";
        case TOK_KEY_ELSE: return "else";
        case TOK_KEY_SWITCH: return "switch";
        case TOK_KEY_BREAK: return "break";
        case TOK_KEY_CONTINUE: return "continue";
        case TOK_KEY_RETURN: return "return";
        case TOK_KEY_WHILE: return "while";
        case TOK_KEY_REPEAT: return "repeat";
        case TOK_KEY_FOR: return "for";
        case TOK_KEY_IN: return "in";
        case TOK_KEY_ENUM: return "enum";
        case TOK_KEY_CLASS: return "class";
        case TOK_KEY_STRUCT: return "struct";
        case TOK_KEY_PRIVATE: return "private";
        case TOK_KEY_INTERNAL: return "internal";
        case TOK_KEY_PUBLIC: return "public";
        case TOK_KEY_STATIC: return "static";
        case TOK_KEY_EXTERN: return "extern";
        case TOK_KEY_LAZY: return "lazy";
        case TOK_KEY_CONST: return "const";
        case TOK_KEY_VAR: return "var";
        case TOK_KEY_MODULE: return "module";
        case TOK_KEY_IMPORT: return "import";
        case TOK_KEY_CASE: return "case";
        case TOK_KEY_EVENT: return "event";
        case TOK_KEY_NULL: return "null";
        case TOK_KEY_UNDEFINED: return "undefined";
        case TOK_KEY_ISA: return "is";
        case TOK_KEY_CURRARGS: return "_args";
        case TOK_KEY_CURRFUNC: return "_func";

        // operators
        case TOK_OP_ADD: return "+";
        case TOK_OP_SUB: return "-";
        case TOK_OP_DIV: return "/";
        case TOK_OP_MUL: return "*";
        case TOK_OP_REM: return "%";
        case TOK_OP_ASSIGN: return "=";
        case TOK_OP_LESS: return "<";
        case TOK_OP_GREATER: return ">";
        case TOK_OP_LESS_EQUAL: return "<=";
        case TOK_OP_GREATER_EQUAL: return ">=";
        case TOK_OP_ADD_ASSIGN: return "+=";
        case TOK_OP_SUB_ASSIGN: return "-=";
        case TOK_OP_DIV_ASSIGN: return "/=";
        case TOK_OP_MUL_ASSIGN: return "*=";
        case TOK_OP_REM_ASSIGN: return "%=";
        case TOK_OP_NOT: return "!";
        case TOK_OP_AND: return "&&";
        case TOK_OP_OR: return "||";
        case TOK_OP_ISEQUAL: return "==";
        case TOK_OP_ISNOTEQUAL: return "!=";
        case TOK_OP_RANGE_INCLUDED: return "...";
        case TOK_OP_RANGE_EXCLUDED: return "..<";
        case TOK_OP_TERNARY: return "?";
        case TOK_OP_SHIFT_LEFT: return "<<";
        case TOK_OP_SHIFT_RIGHT: return ">>";
        case TOK_OP_BIT_AND: return "&";
        case TOK_OP_BIT_OR: return "|";
        case TOK_OP_BIT_XOR: return "^";
        case TOK_OP_BIT_NOT: return "~";
        case TOK_OP_ISIDENTICAL: return "===";
        case TOK_OP_ISNOTIDENTICAL: return "!==";
        case TOK_OP_PATTERN_MATCH: return "~=";
        case TOK_OP_SHIFT_LEFT_ASSIGN: return "<<=";
        case TOK_OP_SHIFT_RIGHT_ASSIGN: return ">>=";
        case TOK_OP_BIT_AND_ASSIGN: return "&=";
        case TOK_OP_BIT_OR_ASSIGN: return "|=";
        case TOK_OP_BIT_XOR_ASSIGN: return "^=";

        case TOK_OP_OPEN_PARENTHESIS: return "(";
        case TOK_OP_CLOSED_PARENTHESIS: return ")";
        case TOK_OP_OPEN_SQUAREBRACKET: return "[";
        case TOK_OP_CLOSED_SQUAREBRACKET: return "]";
        case TOK_OP_OPEN_CURLYBRACE: return "{";
        case TOK_OP_CLOSED_CURLYBRACE: return "}";
        case TOK_OP_SEMICOLON: return ";";
        case TOK_OP_COLON: return ":";
        case TOK_OP_COMMA: return ",";
        case TOK_OP_DOT: return ".";

        case TOK_END: return "";
    }

    // should never reach this point
    return "UNRECOGNIZED TOKEN";
}